

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_func_call(SyntaxAnalyze *this)

{
  irGenerator *this_00;
  pointer pWVar1;
  undefined8 *puVar2;
  int *piVar3;
  _Base_ptr this_01;
  long lVar4;
  undefined8 this_02;
  _Alloc_hider this_03;
  size_type sVar5;
  undefined8 uVar6;
  pointer psVar7;
  bool bVar8;
  int iVar9;
  _Uninitialized<int,_true> _Var10;
  ExpressNode *pEVar11;
  ulong uVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  SymbolKind kind;
  _Base_ptr p_Var14;
  SyntaxAnalyze *in_RSI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  SharedExNdPtr SVar16;
  string strName;
  string name;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  params;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  rightParams;
  string tmpPtrName;
  undefined1 local_268 [16];
  ExpressNode local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  undefined1 *local_208;
  __node_base_ptr local_200;
  undefined1 local_1f8;
  undefined7 uStack_1f7;
  string local_1e8;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  local_1c8;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  undefined1 *local_188;
  long local_180;
  undefined1 local_178 [16];
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  byte local_148;
  size_t *local_140;
  string local_138;
  string local_118;
  string local_f8 [16];
  size_type local_e8 [2];
  string local_d8;
  string local_b8;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined1 local_78;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined1 local_38;
  
  pEVar11 = (ExpressNode *)operator_new(0x48);
  express::ExpressNode::ExpressNode(pEVar11);
  *(ExpressNode **)this = pEVar11;
  local_140 = &this->matched_index;
  local_258._children.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_140,pEVar11);
  local_208 = &local_1f8;
  local_200 = (__node_base_ptr)0x0;
  local_1f8 = 0;
  local_258._name.field_2._M_allocated_capacity = 0;
  local_258._name.field_2._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1c8.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168._M_first._M_storage = (_Uninitialized<int,_true>)0;
  local_148 = 0;
  match_one_word(in_RSI,IDENFR);
  word::Word::get_self_abi_cxx11_
            ((string *)local_268,
             (in_RSI->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start + in_RSI->matched_index);
  std::__cxx11::string::operator=((string *)&local_208,(string *)local_268);
  if ((ExpressNode *)local_268._0_8_ != &local_258) {
    operator_delete((void *)local_268._0_8_,
                    CONCAT71(local_258._1_7_,(undefined1)local_258._type) + 1);
  }
  iVar9 = std::__cxx11::string::compare((char *)&local_208);
  if (iVar9 == 0) {
LAB_001a3697:
    _Var10._M_storage =
         word::Word::get_line_num
                   ((in_RSI->word_list->
                    super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                    _M_impl.super__Vector_impl_data._M_start + in_RSI->matched_index);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_148]._M_data)
              ((anon_class_1_0_00000001 *)local_268,
               (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_168._M_first);
    local_148 = 0;
    local_168._M_first._M_storage = (_Uninitialized<int,_true>)_Var10._M_storage;
    std::get<0ul,int,int,std::__cxx11::string>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_168._M_first);
    std::
    vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(&local_1a8,(value_type *)&local_168._M_first);
  }
  else {
    iVar9 = std::__cxx11::string::compare((char *)&local_208);
    if (iVar9 == 0) goto LAB_001a3697;
  }
  local_f8._0_8_ = local_e8;
  std::__cxx11::string::_M_construct<char*>(local_f8,local_208,local_208 + (long)&local_200->_M_nxt)
  ;
  symbolTable::SymbolTable::find_least_layer_symbol
            ((SymbolTable *)local_268,(string *)&in_RSI->symbolTable);
  this_02 = local_268._8_8_;
  local_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._0_8_;
  local_268._0_8_ = (ExpressNode *)0x0;
  local_268._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((size_type *)local_f8._0_8_ != local_e8) {
    operator_delete((void *)local_f8._0_8_,local_e8[0] + 1);
  }
  match_one_word(in_RSI,LPARENT);
  uVar12 = in_RSI->matched_index + 1;
  pWVar1 = (in_RSI->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_258._name._M_dataplus._M_p = (pointer)this_02;
  local_258._name._M_string_length = (size_type)in_RSI;
  if (uVar12 < (ulong)(((long)(in_RSI->word_list->
                              super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                      -0x5555555555555555)) {
    bVar8 = word::Word::match_token(pWVar1 + uVar12,RPARENT);
    if (!bVar8) goto LAB_001a37ee;
  }
  else {
LAB_001a37ee:
    iVar9 = std::__cxx11::string::compare((char *)&local_208);
    if (iVar9 == 0) {
      local_268._0_8_ = &local_258;
      local_268._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_258._type._0_1_ = '\0';
      local_180 = 0;
      local_178[0] = _S_red;
      local_188 = local_178;
      match_one_word((SyntaxAnalyze *)local_258._name._M_string_length,STRCON);
      sVar5 = local_258._name._M_string_length;
      word::Word::get_self_abi_cxx11_
                (&local_b8,
                 ((*(vector<front::word::Word,_std::allocator<front::word::Word>_> **)
                    (local_258._name._M_string_length + 0x18))->
                 super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
                 super__Vector_impl_data._M_start +
                 *(size_t *)(local_258._name._M_string_length + 8));
      this_00 = (irGenerator *)(sVar5 + 0x80);
      irGenerator::irGenerator::ir_declare_string(&local_1e8,this_00,&local_b8);
      std::__cxx11::string::operator=((string *)local_268,(string *)&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_1e8,this_00,Ptr);
      std::__cxx11::string::operator=((string *)&local_188,(string *)&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      local_98._0_8_ = (long)&local_98 + 0x10;
      std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_188,local_188 + local_180)
      ;
      local_78 = 1;
      local_58._0_8_ = (long)&local_58 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,local_268._0_8_,
                 (pointer)(local_268._0_8_ + (long)(_func_int ***)local_268._8_8_));
      local_38 = 1;
      irGenerator::irGenerator::ir_ref
                (this_00,(LeftVal *)&local_98._M_first,(LeftVal *)&local_58._M_first,false);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[(byte)local_38]._M_data)
                ((anon_class_1_0_00000001 *)&local_1e8,
                 (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58._M_first);
      local_38 = -1;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[(byte)local_78]._M_data)
                ((anon_class_1_0_00000001 *)&local_1e8,
                 (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98._M_first);
      local_78 = -1;
      pEVar11 = (ExpressNode *)operator_new(0x48);
      express::ExpressNode::ExpressNode(pEVar11);
      local_1e8._M_dataplus._M_p = (pointer)pEVar11;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1e8._M_string_length,pEVar11);
      sVar5 = local_1e8._M_string_length;
      local_258._name.field_2._M_allocated_capacity = (size_type)local_1e8._M_dataplus._M_p;
      uVar6 = local_258._name.field_2._8_8_;
      local_1e8._M_dataplus._M_p = (pointer)0x0;
      local_1e8._M_string_length = 0;
      local_258._name.field_2._8_8_ = sVar5;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length);
        }
      }
      *(undefined8 *)local_258._name.field_2._M_allocated_capacity = 0x600000001;
      std::__cxx11::string::_M_assign
                ((string *)(local_258._name.field_2._M_allocated_capacity + 0x10));
      if (local_188 != local_178) {
        operator_delete(local_188,CONCAT71(local_178._1_7_,local_178[0]) + 1);
      }
      if ((ExpressNode *)local_268._0_8_ != &local_258) {
        operator_delete((void *)local_268._0_8_,
                        CONCAT71(local_258._1_7_,(undefined1)local_258._type) + 1);
      }
    }
    else {
      gm_exp((SyntaxAnalyze *)local_268);
      uVar6 = local_258._name.field_2._8_8_;
      local_258._name.field_2._8_8_ = local_268._8_8_;
      local_258._name.field_2._M_allocated_capacity = local_268._0_8_;
      local_268._0_8_ = (ExpressNode *)0x0;
      local_268._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
        }
      }
    }
    std::
    vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
    ::push_back(&local_1c8,(value_type *)&local_258._name.field_2);
    while( true ) {
      pWVar1 = ((*(vector<front::word::Word,_std::allocator<front::word::Word>_> **)
                  (local_258._name._M_string_length + 0x18))->
               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)((*(vector<front::word::Word,_std::allocator<front::word::Word>_> **)
                            (local_258._name._M_string_length + 0x18))->
                         super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                 -0x5555555555555555) <= *(size_t *)(local_258._name._M_string_length + 8) + 1)
      break;
      bVar8 = word::Word::match_token
                        (pWVar1 + *(size_t *)(local_258._name._M_string_length + 8) + 1,COMMA);
      if (!bVar8) break;
      match_one_word((SyntaxAnalyze *)local_258._name._M_string_length,COMMA);
      gm_exp((SyntaxAnalyze *)local_268);
      uVar6 = local_258._name.field_2._8_8_;
      local_258._name.field_2._8_8_ = local_268._8_8_;
      local_258._name.field_2._M_allocated_capacity = local_268._0_8_;
      local_268._0_8_ = (ExpressNode *)0x0;
      local_268._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
        }
      }
      std::
      vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ::push_back(&local_1c8,(value_type *)&local_258._name.field_2);
    }
  }
  sVar5 = local_258._name._M_string_length;
  match_one_word((SyntaxAnalyze *)local_258._name._M_string_length,RPARENT);
  _Var13._M_pi = local_210._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02 ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (*(int *)&(((_Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                    *)&local_210._M_pi[3]._vptr__Sp_counted_base)->_M_impl).super__Vector_impl_data.
                 _M_start == 0) goto LAB_001a3862;
LAB_001a3c29:
    local_258._children.
    super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(_Var13._M_pi + 3);
    puVar2 = *(undefined8 **)
              local_258._children.
              super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *puVar2 = 0x100000001;
    std::__cxx11::string::_M_assign((string *)(puVar2 + 2));
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(this_02 + 8) = *(_Atomic_word *)(this_02 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(this_02 + 8) = *(_Atomic_word *)(this_02 + 8) + 1;
    }
    iVar9 = *(int *)&(((_Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                        *)&local_210._M_pi[3]._vptr__Sp_counted_base)->_M_impl).
                     super__Vector_impl_data._M_start;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
    if (iVar9 != 0) goto LAB_001a3c29;
LAB_001a3862:
    p_Var15 = _Var13._M_pi + 3;
    irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
              ((string *)local_268,(irGenerator *)(sVar5 + 0x80),Int);
    puVar2 = *(undefined8 **)
              local_258._children.
              super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *puVar2 = 1;
    std::__cxx11::string::_M_assign((string *)(puVar2 + 2));
    local_258._children.
    super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var15;
    if ((ExpressNode *)local_268._0_8_ != &local_258) {
      operator_delete((void *)local_268._0_8_,
                      CONCAT71(local_258._1_7_,(undefined1)local_258._type) + 1);
    }
  }
  psVar7 = local_1c8.
           super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1c8.
      super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1c8.
      super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var14 = (_Base_ptr)
              local_1c8.
              super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      piVar3 = *(int **)p_Var14;
      this_01 = p_Var14->_M_parent;
      if (this_01 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
        }
      }
      if (*piVar3 == 0) {
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_148]._M_data)
                  ((anon_class_1_0_00000001 *)local_268,
                   (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_168._M_first);
        local_168._M_first._M_storage = (_Uninitialized<int,_true>)piVar3[2];
        local_148 = 0;
        std::get<0ul,int,int,std::__cxx11::string>
                  ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_168._M_first);
      }
      else {
        std::variant<int,int,std::__cxx11::string>::operator=
                  ((variant<int,int,std::__cxx11::string> *)&local_168._M_first,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(piVar3 + 4)
                  );
      }
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(&local_1a8,(value_type *)&local_168._M_first);
      if (this_01 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      }
      p_Var14 = (_Base_ptr)&p_Var14->_M_left;
    } while (p_Var14 != (_Base_ptr)psVar7);
  }
  this_03._M_p = local_258._name._M_dataplus._M_p;
  lVar4 = *(long *)(*(long *)local_258._children.
                             super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x10);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,lVar4,
             *(long *)(*(long *)local_258._children.
                                super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x18) + lVar4);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03._M_p ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    kind = *(SymbolKind *)
            &(((_Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                *)&(local_258._children.
                    super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>)->
             _M_impl).super__Vector_impl_data._M_start;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(this_03._M_p + 8) = *(int *)(this_03._M_p + 8) + 1;
      UNLOCK();
      kind = *(SymbolKind *)
              &(((_Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  *)&(local_258._children.
                      super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>)->
               _M_impl).super__Vector_impl_data._M_start;
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(this_03._M_p + 8) = *(int *)(this_03._M_p + 8) + 1;
        UNLOCK();
        goto LAB_001a3d85;
      }
    }
    else {
      *(int *)(this_03._M_p + 8) = *(int *)(this_03._M_p + 8) + 1;
      kind = *(SymbolKind *)
              &(((_Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  *)&(local_258._children.
                      super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>)->
               _M_impl).super__Vector_impl_data._M_start;
    }
    *(int *)(this_03._M_p + 8) = *(int *)(this_03._M_p + 8) + 1;
  }
LAB_001a3d85:
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,*(long *)&(local_210._M_pi)->_M_use_count,
             ((_Alloc_hider *)&local_210._M_pi[1]._vptr__Sp_counted_base)->_M_p +
             *(long *)&(local_210._M_pi)->_M_use_count);
  irGenerator::irGenerator::getFunctionName
            (&local_d8,(irGenerator *)(local_258._name._M_string_length + 0x80),&local_138);
  std::
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_70,&local_1a8);
  irGenerator::irGenerator::ir_function_call
            ((irGenerator *)(local_258._name._M_string_length + 0x80),&local_118,kind,&local_d8,
             &local_70,false);
  std::
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03._M_p);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[local_148]._M_data)
            ((anon_class_1_0_00000001 *)local_268,
             (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_168._M_first);
  std::
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_1a8);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector(&local_1c8);
  _Var13._M_pi = extraout_RDX;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._name.field_2._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._name.field_2._8_8_);
    _Var13._M_pi = extraout_RDX_00;
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
    _Var13._M_pi = extraout_RDX_01;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03._M_p);
    _Var13._M_pi = extraout_RDX_02;
  }
  SVar16.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var13._M_pi;
  SVar16.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_258._children.
       super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  return (SharedExNdPtr)
         SVar16.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_func_call() {
  SharedExNdPtr node(new ExpressNode());
  SharedSyPtr func;
  string name;
  SharedExNdPtr param;
  vector<SharedExNdPtr> params;
  vector<RightVal> rightParams;
  RightVal rightVal;

  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();
  if (name == "starttime" || name == "stoptime") {
    rightVal.emplace<0>(get_least_matched_word().get_line_num());
    rightParams.push_back(rightVal);
  }

  func = symbolTable.find_least_layer_symbol(name);

  match_one_word(Token::LPARENT);
  if (!try_word(1, Token::RPARENT)) {
    if (name == "putf") {
      string strName;
      string tmpPtrName;

      match_one_word(Token::STRCON);

      strName =
          irGenerator.ir_declare_string(get_least_matched_word().get_self());
      tmpPtrName = irGenerator.getNewTmpValueName(TyKind::Ptr);
      irGenerator.ir_ref(tmpPtrName, strName);

      param = SharedExNdPtr(new ExpressNode());
      param->_type = NodeType::VAR;
      param->_operation = OperationType::PTR;
      param->_name = tmpPtrName;
    } else {
      param = gm_exp();
    }
    params.push_back(param);

    while (try_word(1, Token::COMMA)) {
      match_one_word(Token::COMMA);
      param = gm_exp();
      params.push_back(param);
    }
  }
  match_one_word(Token::RPARENT);

  if (std::static_pointer_cast<FunctionSymbol>(func)->getRet() ==
      SymbolKind::INT) {
    string retValue = irGenerator.getNewTmpValueName(TyKind::Int);
    node->_type = NodeType::VAR;
    node->_operation = OperationType::RETURN_FUNC_CALL;
    node->_name = retValue;
  } else {
    node->_type = NodeType::VAR;
    node->_operation = OperationType::VOID_FUNC_CALL;
    node->_name = name;
  }

  for (auto var : params) {
    if (var->_type == NodeType::CNS) {
      rightVal.emplace<0>(var->_value);
    } else {
      rightVal = var->_name;
    }
    rightParams.push_back(rightVal);
  }
  irGenerator.ir_function_call(
      node->_name, std::static_pointer_cast<FunctionSymbol>(func)->getRet(),
      irGenerator.getFunctionName(
          std::static_pointer_cast<FunctionSymbol>(func)->getName()),
      rightParams);

  return node;
}